

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O3

qint64 __thiscall
QHttpMultiPartIODevice::readData(QHttpMultiPartIODevice *this,char *data,qint64 maxSize)

{
  ulong uVar1;
  bool bVar2;
  qsizetype qVar3;
  qint64 qVar4;
  long lVar5;
  size_t sVar6;
  pointer pQVar7;
  QHttpMultiPartPrivate *pQVar8;
  long lVar9;
  char *pcVar10;
  QHttpPartPrivate *this_00;
  long lVar11;
  ulong uVar12;
  size_t __n;
  long in_FS_OFFSET;
  long local_98;
  QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[5]> local_70;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = this->multiPart;
  if ((pQVar8->parts).d.size == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      lVar9 = this->readPointer;
      lVar5 = (this->partOffsets).d.ptr[uVar12];
      qVar4 = QHttpPartPrivate::size((pQVar8->parts).d.ptr[uVar12].d.d.ptr);
      pQVar8 = this->multiPart;
      if (lVar9 < qVar4 + lVar5 + (pQVar8->boundary).d.size + 6) break;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(pQVar8->parts).d.size);
  }
  lVar5 = maxSize + -1;
  lVar9 = 0;
  while (__n = maxSize - lVar9, lVar11 = lVar9, __n != 0 && lVar9 <= maxSize) {
    pQVar8 = this->multiPart;
    uVar1 = (pQVar8->parts).d.size;
    if ((long)uVar1 <= (long)uVar12) {
      if (uVar12 == uVar1) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_70.a.b = &pQVar8->boundary;
        local_70.a.a = (char (*) [3])0x263f1d;
        local_70.b = (char (*) [5])0x268981;
        QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[5]>::
        convertTo<QByteArray>(&local_58,&local_70);
        qVar3 = local_58.d.size;
        lVar5 = this->readPointer;
        lVar11 = (**(code **)(*(long *)this + 0x80))(this);
        sVar6 = local_58.d.size - (long)(qVar3 + (lVar5 - lVar11));
        if ((long)__n <= (long)sVar6) {
          sVar6 = __n;
        }
        pcVar10 = local_58.d.ptr;
        if (local_58.d.ptr == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        memcpy(data + lVar9,pcVar10 + (long)(qVar3 + (lVar5 - lVar11)),sVar6);
        this->readPointer = this->readPointer + sVar6;
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
          }
        }
        lVar11 = sVar6 + lVar9;
      }
      break;
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_70.a.b = &pQVar8->boundary;
    local_70.a.a = (char (*) [3])0x263f1d;
    local_70.b = (char (*) [5])0x269eb2;
    QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[3]>::
    convertTo<QByteArray>
              (&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[3],_QByteArray_&>,_const_char_(&)[3]> *
               )&local_70);
    qVar3 = local_58.d.size;
    lVar11 = this->readPointer - (this->partOffsets).d.ptr[uVar12];
    sVar6 = local_58.d.size - lVar11;
    if (sVar6 != 0 && lVar11 <= local_58.d.size) {
      if ((long)sVar6 < (long)__n) {
        __n = sVar6;
      }
      pcVar10 = local_58.d.ptr;
      if (local_58.d.ptr == (char *)0x0) {
        pcVar10 = (char *)&QByteArray::_empty;
      }
      memcpy(data + lVar9,pcVar10 + lVar11,__n);
      lVar9 = lVar9 + __n;
      this->readPointer = this->readPointer + __n;
      lVar11 = lVar11 + __n;
    }
    if (((maxSize - lVar9 == 0 || maxSize < lVar9) || (lVar11 < qVar3)) ||
       (qVar4 = QHttpPartPrivate::size((this->multiPart->parts).d.ptr[uVar12].d.d.ptr),
       (long)(qVar3 + qVar4) <= lVar11)) {
LAB_001fc1a9:
      bVar2 = true;
      if ((lVar9 < maxSize) &&
         (qVar4 = QHttpPartPrivate::size((this->multiPart->parts).d.ptr[uVar12].d.d.ptr),
         (long)(qVar3 + qVar4) <= lVar11)) {
        if (lVar9 == lVar5) {
          bVar2 = false;
          lVar9 = lVar5;
          local_98 = lVar5;
        }
        else {
          (data + lVar9)[0] = '\r';
          (data + lVar9)[1] = '\n';
          lVar9 = lVar9 + 2;
          this->readPointer = this->readPointer + 2;
          uVar12 = uVar12 + 1;
        }
      }
    }
    else {
      pQVar7 = QList<QHttpPart>::data(&this->multiPart->parts);
      this_00 = pQVar7[uVar12].d.d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QHttpPartPrivate>::detach_helper(&pQVar7[uVar12].d);
        this_00 = pQVar7[uVar12].d.d.ptr;
      }
      qVar4 = QHttpPartPrivate::readData(this_00,data + lVar9,maxSize - lVar9);
      if (qVar4 != -1) {
        lVar9 = lVar9 + qVar4;
        this->readPointer = this->readPointer + qVar4;
        lVar11 = lVar11 + qVar4;
        goto LAB_001fc1a9;
      }
      local_98 = -1;
      bVar2 = false;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    lVar11 = local_98;
    if (!bVar2) break;
  }
  local_98 = lVar11;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_98;
}

Assistant:

qint64 QHttpMultiPartIODevice::readData(char *data, qint64 maxSize)
{
    qint64 bytesRead = 0, index = 0;

    // skip the parts we have already read
    while (index < multiPart->parts.size() &&
           readPointer >= partOffsets.at(index) + multiPart->parts.at(index).d->size()
           + multiPart->boundary.size() + 6) // 6 == 2 boundary dashes, \r\n after boundary, \r\n after multipart
        index++;

    // read the data
    while (bytesRead < maxSize && index < multiPart->parts.size()) {

        // check whether we need to read the boundary of the current part
        QByteArray boundaryData = "--" + multiPart->boundary + "\r\n";
        qint64 boundaryCount = boundaryData.size();
        qint64 partIndex = readPointer - partOffsets.at(index);
        if (partIndex < boundaryCount) {
            qint64 boundaryBytesRead = qMin(boundaryCount - partIndex, maxSize - bytesRead);
            memcpy(data + bytesRead, boundaryData.constData() + partIndex, boundaryBytesRead);
            bytesRead += boundaryBytesRead;
            readPointer += boundaryBytesRead;
            partIndex += boundaryBytesRead;
        }

        // check whether we need to read the data of the current part
        if (bytesRead < maxSize && partIndex >= boundaryCount && partIndex < boundaryCount + multiPart->parts.at(index).d->size()) {
            qint64 dataBytesRead = multiPart->parts[index].d->readData(data + bytesRead, maxSize - bytesRead);
            if (dataBytesRead == -1)
                return -1;
            bytesRead += dataBytesRead;
            readPointer += dataBytesRead;
            partIndex += dataBytesRead;
        }

        // check whether we need to read the ending CRLF of the current part
        if (bytesRead < maxSize && partIndex >= boundaryCount + multiPart->parts.at(index).d->size()) {
            if (bytesRead == maxSize - 1)
                return bytesRead;
            memcpy(data + bytesRead, "\r\n", 2);
            bytesRead += 2;
            readPointer += 2;
            index++;
        }
    }
    // check whether we need to return the final boundary
    if (bytesRead < maxSize && index == multiPart->parts.size()) {
        QByteArray finalBoundary = "--" + multiPart->boundary + "--\r\n";
        qint64 boundaryIndex = readPointer + finalBoundary.size() - size();
        qint64 lastBoundaryBytesRead = qMin(finalBoundary.size() - boundaryIndex, maxSize - bytesRead);
        memcpy(data + bytesRead, finalBoundary.constData() + boundaryIndex, lastBoundaryBytesRead);
        bytesRead += lastBoundaryBytesRead;
        readPointer += lastBoundaryBytesRead;
    }
    return bytesRead;
}